

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplePreprocessor.hpp
# Opt level: O2

bool __thiscall
OpenMD::SimplePreprocessor::doPreprocess
          (SimplePreprocessor *this,istream *myStream,string *filename,int startingLine,ostream *os,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defineSet,stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *ifStates)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  ostream *poVar5;
  long *plVar6;
  _Elt_pointer pbVar7;
  iterator iVar8;
  OpenMDException *this_00;
  char *pcVar9;
  SimplePreprocessor subPreprocessor;
  int local_24dc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string includeFilename;
  string line;
  string local_2460;
  string local_2440;
  StringTokenizer tokenizer;
  ifstream includeStream;
  stringstream ss;
  ostream local_21b0 [376];
  char buffer [8192];
  
  poVar5 = std::operator<<(os,"#line ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,startingLine);
  poVar5 = std::operator<<(poVar5," \"");
  poVar5 = std::operator<<(poVar5,(string *)filename);
  std::operator<<(poVar5,"\"\n");
  p_Var1 = &(defineSet->_M_t)._M_impl.super__Rb_tree_header;
  local_24dc = startingLine + 1;
  do {
    plVar6 = (long *)std::istream::getline((char *)myStream,(long)buffer);
    uVar2 = *(uint *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20);
    if ((uVar2 & 5) != 0) {
LAB_0012b8f0:
      return (uVar2 & 5) != 0;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2440,buffer,(allocator<char> *)&ss);
    std::locale::locale((locale *)&includeStream);
    Utils::trimLeftCopy(&line,&local_2440,(locale *)&includeStream);
    std::locale::~locale((locale *)&includeStream);
    std::__cxx11::string::~string((string *)&local_2440);
    if ((line._M_string_length != 0) && (*line._M_dataplus._M_p == '#')) {
      std::__cxx11::string::substr((ulong)&includeStream,(ulong)&line);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss," ;\t\n\r",(allocator<char> *)&includeFilename);
      StringTokenizer::StringTokenizer(&tokenizer,(string *)&includeStream,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::~string((string *)&includeStream);
      StringTokenizer::getAllTokens_abi_cxx11_(&tokens,&tokenizer);
      if (tokens.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          tokens.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar3 = std::operator==(tokens.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,"endif");
        if (bVar3) {
          std::deque<bool,_std::allocator<bool>_>::pop_back(&ifStates->c);
          if ((ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur !=
              (ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur) {
LAB_0012b5f7:
            std::endl<char,std::char_traits<char>>(os);
LAB_0012b779:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&tokens);
            StringTokenizer::~StringTokenizer(&tokenizer);
            goto LAB_0012b790;
          }
          std::operator<<((ostream *)&std::cout,"Error in preprocessing: endif \n");
        }
        else if ((long)tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start == 0x40) {
          bVar3 = std::operator==(tokens.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,"include");
          if (!bVar3) {
            bVar3 = std::operator==(tokens.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,"define");
            if (bVar3) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)defineSet,
                         tokens.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            else {
              bVar3 = std::operator==(tokens.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,"undef");
              if (bVar3) {
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase(&defineSet->_M_t,
                        tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
              }
              else {
                bVar3 = std::operator==(tokens.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,"ifdef");
                if (bVar3) {
                  iVar8 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::find(&defineSet->_M_t,
                                 tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1);
                  if ((_Rb_tree_header *)iVar8._M_node == p_Var1) {
                    includeStream = (ifstream)0x0;
                    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                              (&ifStates->c,(bool *)&includeStream);
                  }
                  else {
                    includeStream = (ifstream)0x1;
                    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                              (&ifStates->c,(bool *)&includeStream);
                  }
                }
                else {
                  bVar3 = std::operator==(tokens.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,"ifndef");
                  if (!bVar3) {
                    poVar5 = std::operator<<((ostream *)&std::cout,
                                             (string *)
                                             tokens.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                    poVar5 = std::operator<<(poVar5," is not supported (yet).");
                    std::endl<char,std::char_traits<char>>(poVar5);
                    goto LAB_0012b8cf;
                  }
                  iVar8 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::find(&defineSet->_M_t,
                                 tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1);
                  if ((_Rb_tree_header *)iVar8._M_node == p_Var1) {
                    includeStream = (ifstream)0x1;
                    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                              (&ifStates->c,(bool *)&includeStream);
                  }
                  else {
                    includeStream = (ifstream)0x0;
                    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                              (&ifStates->c,(bool *)&includeStream);
                  }
                }
              }
            }
            goto LAB_0012b5f7;
          }
          std::__cxx11::string::string
                    ((string *)&includeFilename,
                     (string *)
                     (tokens.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1));
          std::__cxx11::string::substr((ulong)&includeStream,(ulong)&includeFilename);
          std::__cxx11::string::operator=((string *)&includeFilename,(string *)&includeStream);
          std::__cxx11::string::~string((string *)&includeStream);
          std::ifstream::ifstream((istream *)&includeStream,includeFilename._M_dataplus._M_p,_S_in);
          cVar4 = std::__basic_file<char>::is_open();
          if (cVar4 == '\0') {
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            poVar5 = std::operator<<(local_21b0,"Can not open ");
            poVar5 = std::operator<<(poVar5,(string *)&includeFilename);
            std::operator<<(poVar5," for preprocessing\n");
            this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(this_00,&local_2460);
            __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
          bVar3 = doPreprocess(&subPreprocessor,(istream *)&includeStream,&includeFilename,1,os,
                               defineSet,ifStates);
          poVar5 = (ostream *)&std::cout;
          pcVar9 = "Error in preprocessing\n";
          if (bVar3) {
            poVar5 = std::operator<<(os,"#line ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_24dc);
            poVar5 = std::operator<<(poVar5," \"");
            poVar5 = std::operator<<(poVar5,(string *)filename);
            pcVar9 = "\"\n";
          }
          std::operator<<(poVar5,pcVar9);
          std::ifstream::~ifstream((istream *)&includeStream);
          std::__cxx11::string::~string((string *)&includeFilename);
          if (bVar3) goto LAB_0012b779;
        }
      }
LAB_0012b8cf:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
      StringTokenizer::~StringTokenizer(&tokenizer);
      std::__cxx11::string::~string((string *)&line);
      goto LAB_0012b8f0;
    }
    pbVar7 = (ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pbVar7 == (ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pbVar7 = (ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
    }
    if (pbVar7[-1] == true) {
      poVar5 = std::operator<<(os,buffer);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
LAB_0012b790:
    std::__cxx11::string::~string((string *)&line);
    local_24dc = local_24dc + 1;
  } while( true );
}

Assistant:

bool doPreprocess(std::istream& myStream, const std::string& filename, int startingLine, ostream& os, std::set<std::string>& defineSet, std::stack<bool>& ifStates) {
            //std::ifstream input(filename.c_str());
            //if (!input.is_open()) {
            //    std::stringstream ss;
            //    ss << "Can not open " << filename << " for preprocessing\n";
            //    
            //    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            //            "Can not open (%s) for processing. \n"
            //            "\tPlease check md file name syntax.\n", filename.c_str());
            //    
            //    painCave.isFatal = 1;
            //    simError();
            //    
            //    throw OpenMDException(ss.str());                
            //}
            int lineNo = startingLine;
            os << "#line " << lineNo << " \"" << filename << "\"\n";
            const int bufferSize = 8192;
            char buffer[bufferSize];
            while(myStream.getline(buffer, bufferSize)) {
              ++lineNo;
              std::string line = Utils::trimLeftCopy(buffer);
              if (!line.empty() && line[0] == '#') {
                    StringTokenizer tokenizer(line.substr(1, line.length()));
                    std::vector<std::string> tokens = tokenizer.getAllTokens();
                    if (tokens.empty()) {
                        return false;
                    }
                    if (tokens[0] == "endif") {
                        ifStates.pop();
                        if (ifStates.empty()) {
                            std::cout << "Error in preprocessing: endif \n";
                            return false;
                        }
                        os << std::endl;                        
                    } else if (tokens.size() == 2) {
                        if (tokens[0] == "include") {
                            SimplePreprocessor subPreprocessor;
                            std::string includeFilename = tokens[1];
                            includeFilename = includeFilename.substr(1, includeFilename.length() -2);
                            std::ifstream includeStream(includeFilename.c_str());
                            if (!includeStream.is_open()) {
                                std::stringstream ss;
                                ss << "Can not open " << includeFilename << " for preprocessing\n";
                                throw OpenMDException(ss.str()); 
                            }
                            
                            bool ret = subPreprocessor.doPreprocess(includeStream, includeFilename, 1, os, defineSet, ifStates);
                            if (!ret) {
                                std::cout << "Error in preprocessing\n";
                                return false;
                            }
                            os << "#line " << lineNo << " \"" << filename << "\"\n";
                        } else if (tokens[0] == "define") {
                           defineSet.insert(tokens[1]);
                           os << std::endl;
                        } else if (tokens[0] == "undef") {
                           defineSet.erase(tokens[1]);
                           os << std::endl;
                        } else if (tokens[0] == "ifdef") {
                           if (defineSet.find(tokens[1]) != defineSet.end() ) {
                                ifStates.push(true);
                           } else {
                              ifStates.push(false);
                           }
                           os << std::endl;
                        } else if (tokens[0] == "ifndef") {
                           if (defineSet.find(tokens[1]) == defineSet.end() ) {
                                ifStates.push(true);
                           } else {
                              ifStates.push(false);
                           }
                           os << std::endl;
                        } else {
                            std::cout << tokens[0] << " is not supported (yet)." << std::endl;
                            return false;
                        }
                    }else {
                        return false;
                    }
                    
              }else if (ifStates.top()){
                os << buffer << std::endl;
              }
              
            }

            return true;
        }